

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderMoveToAttribute(xmlTextReaderPtr reader,xmlChar *name)

{
  int iVar1;
  xmlChar *str2;
  long local_40;
  xmlAttrPtr prop;
  xmlNsPtr ns;
  xmlChar *localname;
  xmlChar *prefix;
  xmlChar *name_local;
  xmlTextReaderPtr reader_local;
  
  localname = (xmlChar *)0x0;
  if ((reader == (xmlTextReaderPtr)0x0) || (name == (xmlChar *)0x0)) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node->type == XML_ELEMENT_NODE) {
    prefix = name;
    name_local = (xmlChar *)reader;
    str2 = xmlSplitQName2(name,&localname);
    if (str2 == (xmlChar *)0x0) {
      iVar1 = xmlStrEqual(prefix,"xmlns");
      if (iVar1 == 0) {
        for (local_40 = *(long *)(*(long *)(name_local + 0x70) + 0x58); local_40 != 0;
            local_40 = *(long *)(local_40 + 0x30)) {
          iVar1 = xmlStrEqual(*(xmlChar **)(local_40 + 0x10),prefix);
          if ((iVar1 != 0) &&
             ((*(long *)(local_40 + 0x48) == 0 ||
              (*(long *)(*(long *)(local_40 + 0x48) + 0x18) == 0)))) {
            *(long *)(name_local + 0x78) = local_40;
            return 1;
          }
        }
        reader_local._4_4_ = 0;
      }
      else {
        for (prop = *(xmlAttrPtr *)(*(long *)(name_local + 0x70) + 0x60); prop != (xmlAttrPtr)0x0;
            prop = (xmlAttrPtr)prop->_private) {
          if (prop->children == (_xmlNode *)0x0) {
            *(xmlAttrPtr *)(name_local + 0x78) = prop;
            return 1;
          }
        }
        reader_local._4_4_ = 0;
      }
    }
    else {
      iVar1 = xmlStrEqual(localname,"xmlns");
      if (iVar1 == 0) {
        for (local_40 = *(long *)(*(long *)(name_local + 0x70) + 0x58); local_40 != 0;
            local_40 = *(long *)(local_40 + 0x30)) {
          iVar1 = xmlStrEqual(*(xmlChar **)(local_40 + 0x10),str2);
          if (((iVar1 != 0) && (*(long *)(local_40 + 0x48) != 0)) &&
             (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(local_40 + 0x48) + 0x18),localname),
             iVar1 != 0)) {
            *(long *)(name_local + 0x78) = local_40;
            goto LAB_001f3354;
          }
        }
      }
      else {
        for (prop = *(xmlAttrPtr *)(*(long *)(name_local + 0x70) + 0x60); prop != (xmlAttrPtr)0x0;
            prop = (xmlAttrPtr)prop->_private) {
          if ((prop->children != (_xmlNode *)0x0) &&
             (iVar1 = xmlStrEqual((xmlChar *)prop->children,str2), iVar1 != 0)) {
            *(xmlAttrPtr *)(name_local + 0x78) = prop;
LAB_001f3354:
            if (str2 != (xmlChar *)0x0) {
              (*xmlFree)(str2);
            }
            if (localname != (xmlChar *)0x0) {
              (*xmlFree)(localname);
            }
            return 1;
          }
        }
      }
      if (str2 != (xmlChar *)0x0) {
        (*xmlFree)(str2);
      }
      if (localname != (xmlChar *)0x0) {
        (*xmlFree)(localname);
      }
      reader_local._4_4_ = 0;
    }
  }
  else {
    reader_local._4_4_ = 0;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderMoveToAttribute(xmlTextReaderPtr reader, const xmlChar *name) {
    xmlChar *prefix = NULL;
    xmlChar *localname;
    xmlNsPtr ns;
    xmlAttrPtr prop;

    if ((reader == NULL) || (name == NULL))
	return(-1);
    if (reader->node == NULL)
	return(-1);

    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);

    localname = xmlSplitQName2(name, &prefix);
    if (localname == NULL) {
	/*
	 * Namespace default decl
	 */
	if (xmlStrEqual(name, BAD_CAST "xmlns")) {
	    ns = reader->node->nsDef;
	    while (ns != NULL) {
		if (ns->prefix == NULL) {
		    reader->curnode = (xmlNodePtr) ns;
		    return(1);
		}
		ns = ns->next;
	    }
	    return(0);
	}

	prop = reader->node->properties;
	while (prop != NULL) {
	    /*
	     * One need to have
	     *   - same attribute names
	     *   - and the attribute carrying that namespace
	     */
	    if ((xmlStrEqual(prop->name, name)) &&
		((prop->ns == NULL) || (prop->ns->prefix == NULL))) {
		reader->curnode = (xmlNodePtr) prop;
		return(1);
	    }
	    prop = prop->next;
	}
	return(0);
    }

    /*
     * Namespace default decl
     */
    if (xmlStrEqual(prefix, BAD_CAST "xmlns")) {
	ns = reader->node->nsDef;
	while (ns != NULL) {
	    if ((ns->prefix != NULL) && (xmlStrEqual(ns->prefix, localname))) {
		reader->curnode = (xmlNodePtr) ns;
		goto found;
	    }
	    ns = ns->next;
	}
	goto not_found;
    }
    prop = reader->node->properties;
    while (prop != NULL) {
	/*
	 * One need to have
	 *   - same attribute names
	 *   - and the attribute carrying that namespace
	 */
	if ((xmlStrEqual(prop->name, localname)) &&
	    (prop->ns != NULL) && (xmlStrEqual(prop->ns->prefix, prefix))) {
	    reader->curnode = (xmlNodePtr) prop;
	    goto found;
	}
	prop = prop->next;
    }
not_found:
    if (localname != NULL)
        xmlFree(localname);
    if (prefix != NULL)
        xmlFree(prefix);
    return(0);

found:
    if (localname != NULL)
        xmlFree(localname);
    if (prefix != NULL)
        xmlFree(prefix);
    return(1);
}